

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isWellFormedIPv6Reference(XMLCh *addr,XMLSize_t length)

{
  int iVar1;
  ulong uVar2;
  ulong local_50;
  XMLSize_t shiftCount;
  int prevCount;
  XMLSize_t index;
  int iIndex;
  int counter;
  XMLSize_t end;
  XMLSize_t length_local;
  XMLCh *addr_local;
  
  _iIndex = length - 1;
  if (((length < 3) || (*addr != L'[')) || (addr[_iIndex] != L']')) {
    addr_local._7_1_ = false;
  }
  else {
    index._4_4_ = 0;
    end = length;
    length_local = (XMLSize_t)addr;
    index._0_4_ = scanHexSequence(addr,1,_iIndex,(int *)((long)&index + 4));
    if ((int)index == -1) {
      addr_local._7_1_ = false;
    }
    else {
      uVar2 = (ulong)(int)index;
      if (uVar2 == _iIndex) {
        addr_local._7_1_ = index._4_4_ == 8;
      }
      else if ((uVar2 + 1 < _iIndex) && (*(short *)(length_local + uVar2 * 2) == 0x3a)) {
        if (*(short *)(length_local + 2 + uVar2 * 2) == 0x3a) {
          iVar1 = index._4_4_ + 1;
          if (iVar1 < 9) {
            if (uVar2 + 2 == _iIndex) {
              addr_local._7_1_ = true;
            }
            else {
              index._4_4_ = iVar1;
              index._0_4_ = scanHexSequence((XMLCh *)length_local,uVar2 + 2,_iIndex,
                                            (int *)((long)&index + 4));
              if ((int)index == -1) {
                addr_local._7_1_ = false;
              }
              else {
                local_50 = (ulong)(int)index;
                if (local_50 == _iIndex) {
                  addr_local._7_1_ = true;
                }
                else {
                  if (iVar1 < index._4_4_) {
                    local_50 = local_50 + 1;
                  }
                  addr_local._7_1_ =
                       isWellFormedIPv4Address
                                 ((XMLCh *)(length_local + local_50 * 2),_iIndex - local_50);
                }
              }
            }
          }
          else {
            addr_local._7_1_ = false;
          }
        }
        else if (index._4_4_ == 6) {
          addr_local._7_1_ =
               isWellFormedIPv4Address
                         ((XMLCh *)(length_local + uVar2 * 2 + 2),(_iIndex - uVar2) - 1);
        }
        else {
          addr_local._7_1_ = false;
        }
      }
      else {
        addr_local._7_1_ = false;
      }
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool XMLUri::isWellFormedIPv6Reference(const XMLCh* const addr, const XMLSize_t length)
{
    XMLSize_t end = length-1;

    // Check if string is a potential match for IPv6reference.
    if (!(length > 2 && addr[0] == chOpenSquare && addr[end] == chCloseSquare))
    {
        return false;
    }

    // Counter for the number of 16-bit sections read in the address.
    int counter = 0;

    // Scan hex sequence before possible '::' or IPv4 address.
    int iIndex = scanHexSequence(addr, 1, end, counter);
    if (iIndex == -1)
        return false;

    XMLSize_t index=(XMLSize_t)iIndex;
    // Address must contain 128-bits of information.
    if (index == end)
    {
       return (counter == 8);
    }

    if (index+1 < end && addr[index] == chColon)
    {
        if (addr[index+1] == chColon)
        {
            // '::' represents at least one 16-bit group of zeros.
            if (++counter > 8)
            {
                return false;
            }
            index += 2;
            // Trailing zeros will fill out the rest of the address.
            if (index == end)
            {
                return true;
            }
        }
        // If the second character wasn't ':', in order to be valid,
        // the remainder of the string must match IPv4Address,
        // and we must have read exactly 6 16-bit groups.
        else
        {
            if (counter == 6)
                return isWellFormedIPv4Address(addr+index+1, end-index-1);
            else
                return false;
        }
    }
    else
    {
       return false;
    }

    // 3. Scan hex sequence after '::'.
    int prevCount = counter;
    iIndex = scanHexSequence(addr, index, end, counter);
    if (iIndex == -1)
        return false;

    index=(XMLSize_t)iIndex;
    // If this is the end of the address then
    // we've got 128-bits of information.
    if (index == end)
    {
        return true;
    }

    // The address ends in an IPv4 address, or it is invalid.
    // scanHexSequence has already made sure that we have the right number of bits.
    XMLSize_t shiftCount = (counter > prevCount) ? index+1 : index;
    return isWellFormedIPv4Address(addr + shiftCount, end - shiftCount);
}